

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O0

bool ProcessArray<aiVector3t<float>>
               (aiVector3t<float> **in,uint num,char *name,
               vector<bool,_std::allocator<bool>_> *dirtyMask,bool mayBeIdentical,bool mayBeZero)

{
  Logger *this;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar1;
  basic_formatter *this_00;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_60;
  char *local_40;
  char *err;
  bool mayBeZero_local;
  vector<bool,_std::allocator<bool>_> *pvStack_30;
  bool mayBeIdentical_local;
  vector<bool,_std::allocator<bool>_> *dirtyMask_local;
  char *name_local;
  aiVector3t<float> **ppaStack_18;
  uint num_local;
  aiVector3t<float> **in_local;
  
  err._6_1_ = mayBeZero;
  err._7_1_ = mayBeIdentical;
  pvStack_30 = dirtyMask;
  dirtyMask_local = (vector<bool,_std::allocator<bool>_> *)name;
  name_local._4_4_ = num;
  ppaStack_18 = in;
  local_40 = ValidateArrayContents<aiVector3t<float>>(*in,num,dirtyMask,mayBeIdentical,mayBeZero);
  if (local_40 == (char *)0x0) {
    in_local._7_1_ = false;
  }
  else {
    this = Assimp::DefaultLogger::get();
    Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[38]>(&local_1d8,(char (*) [38])"FindInvalidDataProcess fails on mesh ");
    pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_1d8,(char **)&dirtyMask_local);
    pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator_(pbVar1,(char (*) [3])0xc5464c);
    this_00 = (basic_formatter *)
              Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_(pbVar1,&local_40);
    Assimp::Formatter::basic_formatter::operator_cast_to_string(&local_60,this_00);
    Assimp::Logger::error(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1d8);
    if (*ppaStack_18 != (aiVector3t<float> *)0x0) {
      operator_delete__(*ppaStack_18);
    }
    *ppaStack_18 = (aiVector3t<float> *)0x0;
    in_local._7_1_ = true;
  }
  return in_local._7_1_;
}

Assistant:

inline 
bool ProcessArray(T*& in, unsigned int num,const char* name,
        const std::vector<bool>& dirtyMask, bool mayBeIdentical = false, bool mayBeZero = true) {
    const char* err = ValidateArrayContents(in,num,dirtyMask,mayBeIdentical,mayBeZero);
    if (err)    {
        ASSIMP_LOG_ERROR_F( "FindInvalidDataProcess fails on mesh ", name, ": ", err);
        delete[] in;
        in = NULL;
        return true;
    }
    return false;
}